

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O1

void __thiscall lunasvg::SVGTextElement::SVGTextElement(SVGTextElement *this,Document *document)

{
  SVGTextPositioningElement::SVGTextPositioningElement
            (&this->super_SVGTextPositioningElement,document,Text);
  (this->super_SVGTextPositioningElement).super_SVGGraphicsElement.super_SVGElement.super_SVGNode.
  _vptr_SVGNode = (_func_int **)&PTR__SVGTextElement_0015b1b8;
  (this->m_fragments).
  super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fragments).
  super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fragments).
  super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_text)._M_dataplus._M_p = (pointer)&(this->m_text).field_2;
  (this->m_text)._M_string_length = 0;
  (this->m_text).field_2._M_local_buf[0] = L'\0';
  return;
}

Assistant:

SVGTextElement::SVGTextElement(Document* document)
    : SVGTextPositioningElement(document, ElementID::Text)
{
}